

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O0

void __thiscall trng::mt19937::mt19937(mt19937 *this)

{
  mt19937 *in_RDI;
  
  status_type::status_type(&in_RDI->S);
  seed(in_RDI,0x1571);
  return;
}

Assistant:

mt19937::mt19937() { seed(5489u); }